

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O0

void google::protobuf::internal::WireFormatLite::WriteFixed64
               (int field_number,uint64 value,CodedOutputStream *output)

{
  uint32 value_00;
  CodedOutputStream *output_local;
  uint64 value_local;
  int field_number_local;
  
  value_00 = MakeTag(field_number,WIRETYPE_FIXED64);
  io::CodedOutputStream::WriteTag(output,value_00);
  io::CodedOutputStream::WriteLittleEndian64(output,value);
  return;
}

Assistant:

void WireFormatLite::WriteFixed64(int field_number, uint64 value,
                                  io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED64, output);
  WriteFixed64NoTag(value, output);
}